

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb_test_helper.c
# Opt level: O1

char * test_database_path(char *filename)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char cwd [500];
  char acStack_218 [512];
  
  getcwd(acStack_218,500);
  pcVar2 = __xpg_basename(acStack_218);
  iVar1 = strcmp(pcVar2,"t");
  pcVar2 = (char *)malloc(500);
  if (pcVar2 != (char *)0x0) {
    pcVar3 = "./t/maxmind-db/test-data";
    if (iVar1 == 0) {
      pcVar3 = "./maxmind-db/test-data";
    }
    snprintf(pcVar2,500,"%s/%s",pcVar3,filename);
    return pcVar2;
  }
  __assert_fail("NULL != path",
                "/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/maxminddb_test_helper.c"
                ,0x42,"char *test_database_path(const char *)");
}

Assistant:

char *test_database_path(const char *filename) {
    char *test_db_dir;
#ifdef _WIN32
    test_db_dir = "../t/maxmind-db/test-data";
#else
    char cwd[500];
    char *UNUSED(tmp) = getcwd(cwd, 500);

    if (strcmp(basename(cwd), "t") == 0) {
        test_db_dir = "./maxmind-db/test-data";
    } else {
        test_db_dir = "./t/maxmind-db/test-data";
    }
#endif

    char *path = malloc(500);
    assert(NULL != path);

    snprintf(path, 500, "%s/%s", test_db_dir, filename);

    return path;
}